

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlibrary.cpp
# Opt level: O0

void QLibrary::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QLibrary *in_RCX;
  int in_EDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QLibrary::LoadHint> in_stack_0000000c;
  void *_v_1;
  void *_v;
  QLibrary *_t;
  undefined4 in_stack_ffffffffffffff88;
  QFlagsStorage<QLibrary::LoadHint> in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  QLibrary *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    if (in_EDX == 0) {
      fileName(in_stack_ffffffffffffffa0);
      QString::operator=(in_stack_ffffffffffffff90,
                         (QString *)CONCAT44(in_stack_ffffffffffffff8c.i,in_stack_ffffffffffffff88))
      ;
      QString::~QString((QString *)0x8c5e37);
    }
    else if (in_EDX == 1) {
      loadHints((QLibrary *)(in_RCX->super_QObject)._vptr_QObject);
      QtMocHelpers::assignFlags<QFlags<QLibrary::LoadHint>>
                ((void *)0x8c5e5f,(QFlags<QLibrary::LoadHint>)in_stack_ffffffffffffff8c.i);
    }
  }
  if (in_ESI == 2) {
    if (in_EDX == 0) {
      setFileName(in_RCX,in_RDI);
    }
    else if (in_EDX == 1) {
      setLoadHints(in_RCX,(LoadHints)in_stack_0000000c.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLibrary::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLibrary *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->fileName(); break;
        case 1: QtMocHelpers::assignFlags<LoadHints>(_v, _t->loadHints()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFileName(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setLoadHints(*reinterpret_cast<LoadHints*>(_v)); break;
        default: break;
        }
    }
}